

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.hpp
# Opt level: O0

void __thiscall Centaurus::Context<char>::Context(Context<char> *this,char *filename)

{
  int iVar1;
  value_type local_30 [3];
  char *local_18;
  char *filename_local;
  Context<char> *this_local;
  
  local_18 = filename;
  filename_local = (char *)this;
  Grammar<char>::Grammar(&this->m_grammar);
  ParserEM64T<char>::ParserEM64T(&this->m_parser);
  std::
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ::vector(&this->m_callbacks);
  Grammar<char>::parse(&this->m_grammar,local_18,1);
  ParserEM64T<char>::init(&this->m_parser,(EVP_PKEY_CTX *)this);
  iVar1 = Grammar<char>::get_machine_num(&this->m_grammar);
  local_30[0] = (value_type)0x0;
  std::
  vector<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ::resize(&this->m_callbacks,(long)(iVar1 + 1),local_30);
  return;
}

Assistant:

Context(const char *filename)
    {
        /*std::wifstream grammar_file(filename, std::ios::in);

        std::wstring wide_grammar(std::istreambuf_iterator<wchar_t>(grammar_file), {});

        Stream stream(std::move(wide_grammar));*/

        m_grammar.parse(filename);

        m_parser.init(m_grammar);

        m_callbacks.resize(m_grammar.get_machine_num() + 1, nullptr);
    }